

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_global_decodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  int iVar1;
  int iVar2;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar3;
  int c_min;
  int n;
  int c1;
  int c;
  int k;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue str;
  JSValue in_stack_ffffffffffffff58;
  JSValue JVar4;
  JSContext *pJVar5;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  uint local_88;
  int local_84;
  undefined1 local_10 [8];
  int64_t local_8;
  
  JVar3 = JS_ToString((JSContext *)0x1b5d20,in_stack_ffffffffffffff58);
  JVar4 = JVar3;
  iVar1 = JS_IsException(JVar3);
  if (iVar1 == 0) {
    string_buffer_init((JSContext *)JVar4.tag,(StringBuffer *)JVar4.u.ptr,0);
    local_84 = 0;
    while (pJVar5 = (JSContext *)JVar4.tag,
          local_84 < (int)((uint)*(undefined8 *)((long)JVar3.u.ptr + 4) & 0x7fffffff)) {
      iVar1 = string_get((JSString *)JVar3.u.ptr,local_84);
      if (iVar1 == 0x25) {
        local_88 = hex_decode((JSContext *)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                              (JSString *)JVar4.tag,JVar4.u._4_4_);
        pJVar5 = (JSContext *)JVar4.tag;
        if ((int)local_88 < 0) {
LAB_001b5fef:
          JVar4.u._4_4_ = in_stack_ffffffffffffff6c;
          JVar4.u.int32 = in_stack_ffffffffffffff68;
          JVar4.tag._0_4_ = in_stack_ffffffffffffff70;
          JVar4.tag._4_4_ = in_stack_ffffffffffffff74;
          JS_FreeValue(pJVar5,JVar4);
          string_buffer_free((StringBuffer *)0x1b6010);
          local_10 = (undefined1  [8])(stack0xfffffffffffffff4 << 0x20);
          local_8 = 6;
          return _local_10;
        }
        iVar1 = local_84 + 3;
        if ((int)local_88 < 0x80) {
          if ((in_R9D == 0) && (iVar2 = isURIReserved(0), iVar2 != 0)) {
            iVar1 = local_84 + 1;
          }
        }
        else {
          local_84 = iVar1;
          if (((int)local_88 < 0xc0) || (0xdf < (int)local_88)) {
            if (((int)local_88 < 0xe0) || (0xef < (int)local_88)) {
              if (((int)local_88 < 0xf0) || (0xf7 < (int)local_88)) {
                iVar1 = 0;
                in_stack_ffffffffffffff6c = 1;
                local_88 = 0;
              }
              else {
                iVar1 = 3;
                in_stack_ffffffffffffff6c = 0x10000;
                local_88 = local_88 & 7;
              }
            }
            else {
              iVar1 = 2;
              in_stack_ffffffffffffff6c = 0x800;
              local_88 = local_88 & 0xf;
            }
          }
          else {
            iVar1 = 1;
            in_stack_ffffffffffffff6c = 0x80;
            local_88 = local_88 & 0x1f;
          }
          while (in_stack_ffffffffffffff70 = iVar1 + -1, 0 < iVar1) {
            in_stack_ffffffffffffff74 =
                 hex_decode((JSContext *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (JSString *)JVar4.tag,JVar4.u._4_4_);
            pJVar5 = (JSContext *)JVar4.tag;
            if ((int)in_stack_ffffffffffffff74 < 0) goto LAB_001b5fef;
            local_84 = local_84 + 3;
            if ((in_stack_ffffffffffffff74 & 0xc0) != 0x80) {
              local_88 = 0;
              break;
            }
            local_88 = local_88 << 6 | in_stack_ffffffffffffff74 & 0x3f;
            iVar1 = in_stack_ffffffffffffff70;
          }
          pJVar5 = (JSContext *)JVar4.tag;
          if ((((int)local_88 < in_stack_ffffffffffffff6c) || (0x10ffff < (int)local_88)) ||
             ((iVar1 = local_84, 0xd7ff < (int)local_88 && ((int)local_88 < 0xe000)))) {
            js_throw_URIError(in_RDI,"malformed UTF-8");
            goto LAB_001b5fef;
          }
        }
      }
      else {
        iVar1 = local_84 + 1;
      }
      local_84 = iVar1;
      string_buffer_putc((StringBuffer *)JVar4.u.ptr,0);
    }
    JVar3.u._4_4_ = in_stack_ffffffffffffff6c;
    JVar3.u.int32 = in_stack_ffffffffffffff68;
    JVar3.tag._0_4_ = in_stack_ffffffffffffff70;
    JVar3.tag._4_4_ = in_stack_ffffffffffffff74;
    JS_FreeValue(pJVar5,JVar3);
    JVar3 = string_buffer_end((StringBuffer *)pJVar5);
  }
  _local_10 = JVar3;
  return _local_10;
}

Assistant:

static JSValue js_global_decodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1, n, c_min;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);

    p = JS_VALUE_GET_STRING(str);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        if (c == '%') {
            c = hex_decode(ctx, p, k);
            if (c < 0)
                goto fail;
            k += 3;
            if (c < 0x80) {
                if (!isComponent && isURIReserved(c)) {
                    c = '%';
                    k -= 2;
                }
            } else {
                /* Decode URI-encoded UTF-8 sequence */
                if (c >= 0xc0 && c <= 0xdf) {
                    n = 1;
                    c_min = 0x80;
                    c &= 0x1f;
                } else if (c >= 0xe0 && c <= 0xef) {
                    n = 2;
                    c_min = 0x800;
                    c &= 0xf;
                } else if (c >= 0xf0 && c <= 0xf7) {
                    n = 3;
                    c_min = 0x10000;
                    c &= 0x7;
                } else {
                    n = 0;
                    c_min = 1;
                    c = 0;
                }
                while (n-- > 0) {
                    c1 = hex_decode(ctx, p, k);
                    if (c1 < 0)
                        goto fail;
                    k += 3;
                    if ((c1 & 0xc0) != 0x80) {
                        c = 0;
                        break;
                    }
                    c = (c << 6) | (c1 & 0x3f);
                }
                if (c < c_min || c > 0x10FFFF ||
                    (c >= 0xd800 && c < 0xe000)) {
                    js_throw_URIError(ctx, "malformed UTF-8");
                    goto fail;
                }
            }
        } else {
            k++;
        }
        string_buffer_putc(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}